

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

VRIntArray * __thiscall MinVR::VRDatumInt::getValueIntArray(VRDatumInt *this)

{
  value_type_conflict *in_RSI;
  list<int,_std::allocator<int>_> *in_RDI;
  VRIntArray *out;
  list<int,_std::allocator<int>_> *this_00;
  
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x154fef);
  std::__cxx11::list<int,_std::allocator<int>_>::front(in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this_00,in_RSI);
  return (VRIntArray *)in_RDI;
}

Assistant:

VRIntArray getValueIntArray() const {
    VRIntArray out;  out.push_back(value.front());  return out; }